

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall DStrifeStatusBar::DrINumber(DStrifeStatusBar *this,int val,int x,int y,int imgBase)

{
  FTexture *pFVar1;
  int imgBase_local;
  int y_local;
  int x_local;
  int val_local;
  DStrifeStatusBar *this_local;
  
  imgBase_local = x + -7;
  y_local = val;
  if (val == 0) {
    pFVar1 = FImageCollection::operator[](&this->Images,imgBase);
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar1,imgBase_local,y,(FRemapTable *)0x0)
    ;
  }
  else {
    for (; y_local != 0; y_local = y_local / 10) {
      pFVar1 = FImageCollection::operator[](&this->Images,imgBase + y_local % 10);
      DBaseStatusBar::DrawImage
                (&this->super_DBaseStatusBar,pFVar1,imgBase_local,y,(FRemapTable *)0x0);
      imgBase_local = imgBase_local + -7;
    }
  }
  return;
}

Assistant:

void DrINumber (signed int val, int x, int y, int imgBase) const
	{
		x -= 7;

		if (val == 0)
		{
			DrawImage (Images[imgBase], x, y);
		}
		else
		{
			while (val != 0)
			{
				DrawImage (Images[imgBase+val%10], x, y);
				val /= 10;
				x -= 7;
			}
		}
	}